

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsqlfield.cpp
# Opt level: O3

void QSqlField::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  uchar uVar1;
  RequiredStatus RVar2;
  int iVar3;
  QVariant *pQVar4;
  long lVar5;
  QArrayData *pQVar6;
  byte bVar7;
  undefined4 uVar8;
  PrivateShared *pPVar9;
  QExplicitlySharedDataPointer<QSqlFieldPrivate> QVar10;
  byte bVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  long in_FS_OFFSET;
  QVariant QStack_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c != WriteProperty) {
    if ((_c != ReadProperty) || (10 < (uint)_id)) goto LAB_00121c19;
    pQVar4 = (QVariant *)*_a;
    switch(_id) {
    case 0:
      QVariant::QVariant(&QStack_48,(QVariant *)_o);
      QVariant::operator=(pQVar4,&QStack_48);
      goto LAB_00121acf;
    case 1:
      QVariant::QVariant(&QStack_48,(QVariant *)(*(long *)(_o + 0x20) + 0x38));
      QVariant::operator=(pQVar4,&QStack_48);
LAB_00121acf:
      QVariant::~QVariant(&QStack_48);
      goto LAB_00121c19;
    case 2:
      lVar5 = *(long *)(_o + 0x20);
      pPVar9 = *(PrivateShared **)(lVar5 + 8);
      uVar12 = *(undefined8 *)(lVar5 + 0x10);
      uVar13 = *(undefined8 *)(lVar5 + 0x18);
      goto LAB_00121a4b;
    case 3:
      lVar5 = *(long *)(_o + 0x20);
      pPVar9 = *(PrivateShared **)(lVar5 + 0x20);
      uVar12 = *(undefined8 *)(lVar5 + 0x28);
      uVar13 = *(undefined8 *)(lVar5 + 0x30);
LAB_00121a4b:
      if (pPVar9 != (PrivateShared *)0x0) {
        LOCK();
        *(int *)pPVar9 = *(int *)pPVar9 + 1;
        UNLOCK();
      }
      pQVar6 = (QArrayData *)(pQVar4->d).data.shared;
      (pQVar4->d).data.shared = pPVar9;
      *(undefined8 *)((long)&(pQVar4->d).data + 8) = uVar12;
      *(undefined8 *)((long)&(pQVar4->d).data + 0x10) = uVar13;
      if (pQVar6 != (QArrayData *)0x0) {
        LOCK();
        (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i =
             (pQVar6->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pQVar6->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
            QArrayData::deallocate(pQVar6,2,0x10);
            return;
          }
          goto LAB_00121c34;
        }
      }
      goto LAB_00121c19;
    case 4:
      (pQVar4->d).data.shared = *(PrivateShared **)(*(long *)(_o + 0x20) + 0x58);
      goto LAB_00121c19;
    case 5:
      uVar8 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x60);
      break;
    case 6:
      bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x70);
      goto LAB_00121b9f;
    case 7:
      bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 1;
      goto LAB_00121b9f;
    case 8:
      bVar7 = *(byte *)(*(long *)(_o + 0x20) + 0x70) >> 2;
LAB_00121b9f:
      (pQVar4->d).data.data[0] = bVar7 & 1;
      goto LAB_00121c19;
    case 9:
      uVar8 = *(undefined4 *)(*(long *)(_o + 0x20) + 100);
      break;
    case 10:
      uVar8 = *(undefined4 *)(*(long *)(_o + 0x20) + 0x68);
    }
    *(undefined4 *)&(pQVar4->d).data = uVar8;
    goto LAB_00121c19;
  }
  if (10 < (uint)_id) goto LAB_00121c19;
  pQVar4 = (QVariant *)*_a;
  switch(_id) {
  case 0:
    if ((*(byte *)(*(long *)(_o + 0x20) + 0x70) & 1) == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        QVariant::operator=((QVariant *)_o,pQVar4);
        return;
      }
      goto LAB_00121c34;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      setDefaultValue((QSqlField *)_o,pQVar4);
      return;
    }
    goto LAB_00121c34;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      setName((QSqlField *)_o,(QString *)pQVar4);
      return;
    }
    goto LAB_00121c34;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      setTableName((QSqlField *)_o,(QString *)pQVar4);
      return;
    }
    goto LAB_00121c34;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      setMetaType((QSqlField *)_o,(QMetaTypeInterface *)(pQVar4->d).data.shared);
      return;
    }
    goto LAB_00121c34;
  case 5:
    RVar2 = *(RequiredStatus *)&(pQVar4->d).data;
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    ((QSqlFieldPrivate *)QVar10.d.ptr)->req = RVar2;
    break;
  case 6:
    bVar7 = (pQVar4->d).data.data[0];
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    bVar11 = ((QSqlFieldPrivate *)QVar10.d.ptr)->field_0x70 & 0xfe;
    goto LAB_00121c13;
  case 7:
    uVar1 = (pQVar4->d).data.data[0];
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    bVar7 = uVar1 * '\x02';
    bVar11 = ((QSqlFieldPrivate *)QVar10.d.ptr)->field_0x70 & 0xfd;
    goto LAB_00121c13;
  case 8:
    uVar1 = (pQVar4->d).data.data[0];
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    bVar7 = uVar1 << 2;
    bVar11 = ((QSqlFieldPrivate *)QVar10.d.ptr)->field_0x70 & 0xfb;
LAB_00121c13:
    ((QSqlFieldPrivate *)QVar10.d.ptr)->field_0x70 = bVar11 | bVar7;
    break;
  case 9:
    iVar3 = *(int *)&(pQVar4->d).data;
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    ((QSqlFieldPrivate *)QVar10.d.ptr)->len = iVar3;
    break;
  case 10:
    iVar3 = *(int *)&(pQVar4->d).data;
    QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    if ((((QSqlFieldPrivate *)QVar10.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i != 1) {
      QExplicitlySharedDataPointer<QSqlFieldPrivate>::detach_helper
                ((QExplicitlySharedDataPointer<QSqlFieldPrivate> *)(_o + 0x20));
      QVar10.d.ptr = *(totally_ordered_wrapper<QSqlFieldPrivate_*> *)(_o + 0x20);
    }
    ((QSqlFieldPrivate *)QVar10.d.ptr)->prec = iVar3;
  }
LAB_00121c19:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_00121c34:
  __stack_chk_fail();
}

Assistant:

void QSqlField::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = reinterpret_cast<QSqlField *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QVariant*>(_v) = _t->value(); break;
        case 1: *reinterpret_cast<QVariant*>(_v) = _t->defaultValue(); break;
        case 2: *reinterpret_cast<QString*>(_v) = _t->name(); break;
        case 3: *reinterpret_cast<QString*>(_v) = _t->tableName(); break;
        case 4: *reinterpret_cast<QMetaType*>(_v) = _t->metaType(); break;
        case 5: *reinterpret_cast<RequiredStatus*>(_v) = _t->requiredStatus(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isReadOnly(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->isGenerated(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->isAutoValue(); break;
        case 9: *reinterpret_cast<int*>(_v) = _t->length(); break;
        case 10: *reinterpret_cast<int*>(_v) = _t->precision(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 1: _t->setDefaultValue(*reinterpret_cast<QVariant*>(_v)); break;
        case 2: _t->setName(*reinterpret_cast<QString*>(_v)); break;
        case 3: _t->setTableName(*reinterpret_cast<QString*>(_v)); break;
        case 4: _t->setMetaType(*reinterpret_cast<QMetaType*>(_v)); break;
        case 5: _t->setRequiredStatus(*reinterpret_cast<RequiredStatus*>(_v)); break;
        case 6: _t->setReadOnly(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setGenerated(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setAutoValue(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setLength(*reinterpret_cast<int*>(_v)); break;
        case 10: _t->setPrecision(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}